

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_print_longpath.c
# Opt level: O0

void test_print_longpath(void)

{
  size_t sVar1;
  int k;
  int j;
  int i;
  char buff [2048];
  char *reffile;
  char *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7d8;
  char *in_stack_fffffffffffff7e0;
  wchar_t line;
  undefined4 in_stack_fffffffffffff7e8;
  int iVar2;
  int in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f4;
  char *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  wchar_t in_stack_fffffffffffff804;
  char *in_stack_fffffffffffff808;
  char *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffc78;
  wchar_t in_stack_fffffffffffffc84;
  char *in_stack_fffffffffffffc88;
  
  extract_reference_file(in_stack_fffffffffffffbe0);
  memset(&stack0xfffffffffffff7f8,0,0x800);
  for (iVar2 = 0; line = (wchar_t)((ulong)in_stack_fffffffffffff7e0 >> 0x20), iVar2 < 4;
      iVar2 = iVar2 + 1) {
    for (in_stack_fffffffffffff7f0 = 0; in_stack_fffffffffffff7f0 < iVar2 + 1;
        in_stack_fffffffffffff7f0 = in_stack_fffffffffffff7f0 + 1) {
      for (in_stack_fffffffffffff7f4 = 0; in_stack_fffffffffffff7f4 < 10;
          in_stack_fffffffffffff7f4 = in_stack_fffffffffffff7f4 + 1) {
        in_stack_fffffffffffff7e0 = &stack0xfffffffffffff7f8;
        sVar1 = strlen(&stack0xfffffffffffff7f8);
        strncat(in_stack_fffffffffffff7e0,"0123456789",0x7ff - sVar1);
      }
      in_stack_fffffffffffff7d8 = &stack0xfffffffffffff7f8;
      sVar1 = strlen(&stack0xfffffffffffff7f8);
      strncat(in_stack_fffffffffffff7d8,"/",0x7ff - sVar1);
    }
    in_stack_fffffffffffff7d0 = &stack0xfffffffffffff7f8;
    sVar1 = strlen(&stack0xfffffffffffff7f8);
    strncat(in_stack_fffffffffffff7d0,"\n",0x7ff - sVar1);
  }
  systemf("%s -tf %s >test.out 2>test.err",testprog,"test_print_longpath.tar.Z");
  assertion_equal_int((char *)CONCAT44(iVar2,in_stack_fffffffffffff7e8),line,
                      (longlong)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,0,
                      (char *)0x117527,
                      (void *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  assertion_text_file_contents
            (in_stack_fffffffffffff808,in_stack_fffffffffffff804,in_stack_fffffffffffff7f8,
             (char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  assertion_empty_file
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,in_stack_fffffffffffffc78);
  return;
}

Assistant:

DEFINE_TEST(test_print_longpath)
{
	const char *reffile = "test_print_longpath.tar.Z";
	char buff[2048];
	int i, j, k;

	/* Reference file has one entry "file" with a very old timestamp. */
	extract_reference_file(reffile);

	/* Build long path pattern. */
	memset(buff, 0, sizeof(buff));
	for (k = 0; k < 4; k++) {
		for (j = 0; j < k+1; j++) {
			for (i = 0; i < 10; i++)
				strncat(buff, "0123456789",
				    sizeof(buff) - strlen(buff) -1);
			strncat(buff, "/", sizeof(buff) - strlen(buff) -1);
		}
		strncat(buff, "\n", sizeof(buff) - strlen(buff) -1);
	}
	buff[sizeof(buff)-1] = '\0';

	assertEqualInt(0,
	    systemf("%s -tf %s >test.out 2>test.err", testprog, reffile));
	assertTextFileContents(buff, "test.out");
	assertEmptyFile("test.err");
}